

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beta_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::beta_dist<long_double>::pdf(beta_dist<long_double> *this,result_type_conflict3 x)

{
  int *piVar1;
  result_type_conflict3 *extraout_RAX;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  longdouble in_ST0;
  longdouble lVar2;
  longdouble in_ST1;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  
  if (((longdouble)0 <= in_stack_00000008) && (in_stack_00000008 <= (longdouble)1)) {
    lVar2 = in_ST0;
    if ((in_stack_00000008 != (longdouble)0) ||
       (lVar2 = in_ST1, param_type::alpha(in_RDI,in_RSI), (longdouble)0 <= -(longdouble)1 + in_ST0))
    {
      if (((in_stack_00000008 != (longdouble)1) || (NAN(in_stack_00000008) || NAN((longdouble)1)))
         || (param_type::beta(in_RDI,in_RSI), (longdouble)0 <= -(longdouble)1 + lVar2)) {
        param_type::norm(in_RDI,in_RSI);
        param_type::alpha(in_RDI,in_RSI);
        std::pow(__x,in_XMM1_Qa);
        param_type::beta(in_RDI,in_RSI);
        std::pow(__x_00,in_XMM1_Qa);
        return extraout_RAX;
      }
    }
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    in_RDI = (result_type_conflict3 *)std::numeric_limits<long_double>::quiet_NaN();
  }
  return in_RDI;
}

Assistant:

pdf(result_type x) const {
      if (x < 0 or x > 1)
        return 0;
      if ((x == 0 and P.alpha() - 1 < 0) or (x == 1 and P.beta() - 1 < 0)) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return 1 / P.norm() * math::pow(x, P.alpha() - 1) * math::pow(1 - x, P.beta() - 1);
    }